

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void string_set(char **out,char *in)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  
  sVar1 = strlen(in);
  pcVar2 = (char *)realloc(*out,sVar1 + 1);
  if (pcVar2 != (char *)0x0) {
    pcVar2[sVar1] = '\0';
    *out = pcVar2;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        (*out)[sVar3] = in[sVar3];
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  return;
}

Assistant:

static void string_set(char** out, const char* in)
{
	size_t insize = strlen(in), i;
	if (string_resize(out, insize))
	{
		for (i = 0; i != insize; ++i)
		{
			(*out)[i] = in[i];
		}
	}
}